

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  Scene *pSVar7;
  Ref<embree::Geometry> *pRVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  float fVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  int iVar61;
  uint uVar62;
  AABBNodeMB4D *node1;
  ulong uVar63;
  ulong uVar64;
  long lVar65;
  long lVar66;
  ulong uVar67;
  ulong uVar68;
  undefined4 uVar69;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong *puVar76;
  ulong *puVar77;
  ulong uVar78;
  long lVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  long lVar90;
  bool bVar91;
  bool bVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 extraout_var [56];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar128;
  float fVar133;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  float fVar144;
  float fVar145;
  float fVar150;
  float fVar152;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar156;
  float fVar158;
  float fVar160;
  undefined1 auVar148 [32];
  float fVar151;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar157;
  float fVar159;
  float fVar161;
  undefined1 auVar149 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  RTCFilterFunctionNArguments local_db0;
  undefined1 local_d80 [32];
  undefined1 local_d60 [32];
  undefined1 local_d40 [32];
  undefined1 local_d20 [32];
  undefined1 local_d00 [32];
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_cc4;
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined1 local_be0 [16];
  undefined1 local_bd0 [16];
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [32];
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  undefined4 uStack_b44;
  undefined1 local_b40 [32];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  undefined4 uStack_ac8;
  undefined4 uStack_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  float local_9a0 [4];
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  undefined1 auVar107 [64];
  
  local_800 = root.ptr;
  uVar69 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar141._4_4_ = uVar69;
  auVar141._0_4_ = uVar69;
  auVar141._8_4_ = uVar69;
  auVar141._12_4_ = uVar69;
  uVar69 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar146._4_4_ = uVar69;
  auVar146._0_4_ = uVar69;
  auVar146._8_4_ = uVar69;
  auVar146._12_4_ = uVar69;
  uVar69 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar162._4_4_ = uVar69;
  auVar162._0_4_ = uVar69;
  auVar162._8_4_ = uVar69;
  auVar162._12_4_ = uVar69;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar26 = fVar1 * 0.99999964;
  fVar27 = fVar2 * 0.99999964;
  fVar28 = fVar3 * 0.99999964;
  fVar1 = fVar1 * 1.0000004;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  uVar68 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar81 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar86 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar61 = (tray->tnear).field_0.i[k];
  auVar129._4_4_ = iVar61;
  auVar129._0_4_ = iVar61;
  auVar129._8_4_ = iVar61;
  auVar129._12_4_ = iVar61;
  local_b40._16_16_ = mm_lookupmask_ps._240_16_;
  local_b40._0_16_ = mm_lookupmask_ps._0_16_;
  iVar61 = (tray->tfar).field_0.i[k];
  auVar138._4_4_ = iVar61;
  auVar138._0_4_ = iVar61;
  auVar138._8_4_ = iVar61;
  auVar138._12_4_ = iVar61;
  iVar61 = 1 << ((uint)k & 0x1f);
  auVar96._4_4_ = iVar61;
  auVar96._0_4_ = iVar61;
  auVar96._8_4_ = iVar61;
  auVar96._12_4_ = iVar61;
  auVar96._16_4_ = iVar61;
  auVar96._20_4_ = iVar61;
  auVar96._24_4_ = iVar61;
  auVar96._28_4_ = iVar61;
  auVar97 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar96 = vpand_avx2(auVar96,auVar97);
  local_b80 = vpcmpeqd_avx2(auVar96,auVar97);
  auVar102._8_4_ = 0x3f800000;
  auVar102._0_8_ = &DAT_3f8000003f800000;
  auVar102._12_4_ = 0x3f800000;
  auVar102._16_4_ = 0x3f800000;
  auVar102._20_4_ = 0x3f800000;
  auVar102._24_4_ = 0x3f800000;
  auVar102._28_4_ = 0x3f800000;
  auVar97._8_4_ = 0xbf800000;
  auVar97._0_8_ = 0xbf800000bf800000;
  auVar97._12_4_ = 0xbf800000;
  auVar97._16_4_ = 0xbf800000;
  auVar97._20_4_ = 0xbf800000;
  auVar97._24_4_ = 0xbf800000;
  auVar97._28_4_ = 0xbf800000;
  _local_b60 = vblendvps_avx(auVar102,auVar97,local_b40);
  puVar77 = local_7f8;
  do {
    puVar76 = puVar77;
    if (puVar76 == &local_800) break;
    puVar77 = puVar76 + -1;
    uVar89 = puVar76[-1];
    do {
      if ((uVar89 & 8) == 0) {
        uVar63 = uVar89 & 0xfffffffffffffff0;
        uVar69 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar93._4_4_ = uVar69;
        auVar93._0_4_ = uVar69;
        auVar93._8_4_ = uVar69;
        auVar93._12_4_ = uVar69;
        auVar94 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar63 + 0x80 + uVar68),auVar93,
                                  *(undefined1 (*) [16])(uVar63 + 0x20 + uVar68));
        auVar94 = vsubps_avx(auVar94,auVar141);
        auVar100._0_4_ = fVar26 * auVar94._0_4_;
        auVar100._4_4_ = fVar26 * auVar94._4_4_;
        auVar100._8_4_ = fVar26 * auVar94._8_4_;
        auVar100._12_4_ = fVar26 * auVar94._12_4_;
        auVar94 = vmaxps_avx(auVar129,auVar100);
        auVar100 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar63 + 0x80 + uVar81),auVar93,
                                   *(undefined1 (*) [16])(uVar63 + 0x20 + uVar81));
        auVar100 = vsubps_avx(auVar100,auVar146);
        auVar108._0_4_ = fVar27 * auVar100._0_4_;
        auVar108._4_4_ = fVar27 * auVar100._4_4_;
        auVar108._8_4_ = fVar27 * auVar100._8_4_;
        auVar108._12_4_ = fVar27 * auVar100._12_4_;
        auVar100 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar63 + 0x80 + uVar86),auVar93,
                                   *(undefined1 (*) [16])(uVar63 + 0x20 + uVar86));
        auVar100 = vsubps_avx(auVar100,auVar162);
        auVar117._0_4_ = fVar28 * auVar100._0_4_;
        auVar117._4_4_ = fVar28 * auVar100._4_4_;
        auVar117._8_4_ = fVar28 * auVar100._8_4_;
        auVar117._12_4_ = fVar28 * auVar100._12_4_;
        auVar100 = vmaxps_avx(auVar108,auVar117);
        auVar94 = vmaxps_avx(auVar94,auVar100);
        auVar100 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar63 + 0x80 + (uVar68 ^ 0x10)),auVar93,
                                   *(undefined1 (*) [16])(uVar63 + 0x20 + (uVar68 ^ 0x10)));
        auVar100 = vsubps_avx(auVar100,auVar141);
        auVar109._0_4_ = fVar1 * auVar100._0_4_;
        auVar109._4_4_ = fVar1 * auVar100._4_4_;
        auVar109._8_4_ = fVar1 * auVar100._8_4_;
        auVar109._12_4_ = fVar1 * auVar100._12_4_;
        auVar100 = vminps_avx(auVar138,auVar109);
        auVar108 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar63 + 0x80 + (uVar81 ^ 0x10)),auVar93,
                                   *(undefined1 (*) [16])(uVar63 + 0x20 + (uVar81 ^ 0x10)));
        auVar108 = vsubps_avx(auVar108,auVar146);
        auVar109 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar63 + 0x80 + (uVar86 ^ 0x10)),auVar93,
                                   *(undefined1 (*) [16])(uVar63 + 0x20 + (uVar86 ^ 0x10)));
        auVar118._0_4_ = fVar2 * auVar108._0_4_;
        auVar118._4_4_ = fVar2 * auVar108._4_4_;
        auVar118._8_4_ = fVar2 * auVar108._8_4_;
        auVar118._12_4_ = fVar2 * auVar108._12_4_;
        auVar108 = vsubps_avx(auVar109,auVar162);
        auVar122._0_4_ = fVar3 * auVar108._0_4_;
        auVar122._4_4_ = fVar3 * auVar108._4_4_;
        auVar122._8_4_ = fVar3 * auVar108._8_4_;
        auVar122._12_4_ = fVar3 * auVar108._12_4_;
        auVar108 = vminps_avx(auVar118,auVar122);
        auVar100 = vminps_avx(auVar100,auVar108);
        if (((uint)uVar89 & 7) == 6) {
          auVar100 = vcmpps_avx(auVar94,auVar100,2);
          auVar94 = vcmpps_avx(*(undefined1 (*) [16])(uVar63 + 0xe0),auVar93,2);
          auVar108 = vcmpps_avx(auVar93,*(undefined1 (*) [16])(uVar63 + 0xf0),1);
          auVar94 = vandps_avx(auVar94,auVar108);
          auVar94 = vandps_avx(auVar94,auVar100);
        }
        else {
          auVar94 = vcmpps_avx(auVar94,auVar100,2);
        }
        auVar94 = vpslld_avx(auVar94,0x1f);
        uVar69 = vmovmskps_avx(auVar94);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar69);
      }
      if ((uVar89 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar62 = 4;
        }
        else {
          uVar63 = uVar89 & 0xfffffffffffffff0;
          lVar66 = 0;
          for (uVar89 = unaff_RBX; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
            lVar66 = lVar66 + 1;
          }
          for (uVar64 = unaff_RBX - 1 & unaff_RBX; uVar89 = *(ulong *)(uVar63 + lVar66 * 8),
              uVar64 != 0; uVar64 = uVar64 - 1 & uVar64) {
            *puVar77 = uVar89;
            puVar77 = puVar77 + 1;
            lVar66 = 0;
            for (uVar89 = uVar64; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
              lVar66 = lVar66 + 1;
            }
          }
          uVar62 = 0;
        }
      }
      else {
        uVar62 = 6;
      }
    } while (uVar62 == 0);
    if (uVar62 == 6) {
      uVar63 = (ulong)((uint)uVar89 & 0xf);
      uVar62 = 0;
      uVar64 = uVar63 - 8;
      bVar91 = uVar63 != 8;
      if (bVar91) {
        uVar89 = uVar89 & 0xfffffffffffffff0;
        uVar63 = 0;
        do {
          lVar65 = uVar63 * 0x60;
          pSVar7 = context->scene;
          pRVar8 = (pSVar7->geometries).items;
          pGVar9 = pRVar8[*(uint *)(uVar89 + 0x40 + lVar65)].ptr;
          fVar4 = (pGVar9->time_range).lower;
          fVar4 = pGVar9->fnumTimeSegments *
                  ((*(float *)(ray + k * 4 + 0xe0) - fVar4) / ((pGVar9->time_range).upper - fVar4));
          auVar94 = vroundss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),9);
          auVar94 = vminss_avx(auVar94,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
          auVar95 = vmaxss_avx(ZEXT816(0) << 0x20,auVar94);
          iVar61 = (int)auVar95._0_4_;
          lVar79 = (long)iVar61 * 0x38;
          lVar66 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar79);
          uVar78 = (ulong)*(uint *)(uVar89 + 4 + lVar65);
          auVar94 = *(undefined1 (*) [16])(lVar66 + (ulong)*(uint *)(uVar89 + lVar65) * 4);
          uVar70 = (ulong)*(uint *)(uVar89 + 0x10 + lVar65);
          auVar100 = *(undefined1 (*) [16])(lVar66 + uVar70 * 4);
          uVar67 = (ulong)*(uint *)(uVar89 + 0x20 + lVar65);
          auVar108 = *(undefined1 (*) [16])(lVar66 + uVar67 * 4);
          uVar71 = (ulong)*(uint *)(uVar89 + 0x30 + lVar65);
          auVar109 = *(undefined1 (*) [16])(lVar66 + uVar71 * 4);
          lVar66 = *(long *)&pRVar8[*(uint *)(uVar89 + 0x44 + lVar65)].ptr[2].numPrimitives;
          lVar10 = *(long *)(lVar66 + lVar79);
          auVar93 = *(undefined1 (*) [16])(lVar10 + uVar78 * 4);
          uVar72 = (ulong)*(uint *)(uVar89 + 0x14 + lVar65);
          auVar117 = *(undefined1 (*) [16])(lVar10 + uVar72 * 4);
          uVar73 = (ulong)*(uint *)(uVar89 + 0x24 + lVar65);
          auVar118 = *(undefined1 (*) [16])(lVar10 + uVar73 * 4);
          uVar74 = (ulong)*(uint *)(uVar89 + 0x34 + lVar65);
          auVar122 = *(undefined1 (*) [16])(lVar10 + uVar74 * 4);
          lVar10 = *(long *)&pRVar8[*(uint *)(uVar89 + 0x48 + lVar65)].ptr[2].numPrimitives;
          lVar11 = *(long *)(lVar10 + lVar79);
          uVar75 = (ulong)*(uint *)(uVar89 + 8 + lVar65);
          auVar119 = *(undefined1 (*) [16])(lVar11 + uVar75 * 4);
          uVar82 = (ulong)*(uint *)(uVar89 + 0x18 + lVar65);
          auVar174 = *(undefined1 (*) [16])(lVar11 + uVar82 * 4);
          uVar83 = (ulong)*(uint *)(uVar89 + 0x28 + lVar65);
          auVar6 = *(undefined1 (*) [16])(lVar11 + uVar83 * 4);
          uVar84 = (ulong)*(uint *)(uVar89 + 0x38 + lVar65);
          auVar163 = *(undefined1 (*) [16])(lVar11 + uVar84 * 4);
          fVar4 = fVar4 - auVar95._0_4_;
          lVar11 = *(long *)&pRVar8[*(uint *)(uVar89 + 0x4c + lVar65)].ptr[2].numPrimitives;
          lVar79 = *(long *)(lVar11 + lVar79);
          uVar88 = (ulong)*(uint *)(uVar89 + 0xc + lVar65);
          auVar95 = *(undefined1 (*) [16])(lVar79 + uVar88 * 4);
          uVar87 = (ulong)*(uint *)(uVar89 + 0x1c + lVar65);
          auVar110 = *(undefined1 (*) [16])(lVar79 + uVar87 * 4);
          auVar142 = vunpcklps_avx(auVar94,auVar119);
          auVar119 = vunpckhps_avx(auVar94,auVar119);
          auVar130 = vunpcklps_avx(auVar93,auVar95);
          auVar93 = vunpckhps_avx(auVar93,auVar95);
          uVar80 = (ulong)*(uint *)(uVar89 + 0x2c + lVar65);
          auVar94 = *(undefined1 (*) [16])(lVar79 + uVar80 * 4);
          auVar95 = vunpcklps_avx(auVar119,auVar93);
          local_b90 = vunpcklps_avx(auVar142,auVar130);
          auVar93 = vunpckhps_avx(auVar142,auVar130);
          auVar142 = vunpcklps_avx(auVar100,auVar174);
          auVar119 = vunpckhps_avx(auVar100,auVar174);
          auVar174 = vunpcklps_avx(auVar117,auVar110);
          auVar117 = vunpckhps_avx(auVar117,auVar110);
          uVar85 = (ulong)*(uint *)(uVar89 + 0x3c + lVar65);
          auVar100 = *(undefined1 (*) [16])(lVar79 + uVar85 * 4);
          auVar119 = vunpcklps_avx(auVar119,auVar117);
          auVar110 = vunpcklps_avx(auVar142,auVar174);
          auVar117 = vunpckhps_avx(auVar142,auVar174);
          auVar174 = vunpcklps_avx(auVar108,auVar6);
          auVar108 = vunpckhps_avx(auVar108,auVar6);
          auVar6 = vunpcklps_avx(auVar118,auVar94);
          auVar118 = vunpckhps_avx(auVar118,auVar94);
          lVar90 = (long)(iVar61 + 1) * 0x38;
          lVar79 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar90);
          auVar94 = *(undefined1 (*) [16])(lVar79 + (ulong)*(uint *)(uVar89 + lVar65) * 4);
          local_ba0 = vunpcklps_avx(auVar108,auVar118);
          auVar142 = vunpcklps_avx(auVar174,auVar6);
          local_be0 = vunpckhps_avx(auVar174,auVar6);
          auVar118 = vunpcklps_avx(auVar109,auVar163);
          auVar108 = vunpckhps_avx(auVar109,auVar163);
          auVar174 = vunpcklps_avx(auVar122,auVar100);
          auVar109 = vunpckhps_avx(auVar122,auVar100);
          lVar10 = *(long *)(lVar10 + lVar90);
          auVar100 = *(undefined1 (*) [16])(lVar10 + uVar75 * 4);
          local_bb0 = vunpcklps_avx(auVar108,auVar109);
          local_bc0 = vunpcklps_avx(auVar118,auVar174);
          local_bd0 = vunpckhps_avx(auVar118,auVar174);
          lVar66 = *(long *)(lVar66 + lVar90);
          auVar109 = vunpcklps_avx(auVar94,auVar100);
          auVar108 = vunpckhps_avx(auVar94,auVar100);
          auVar94 = *(undefined1 (*) [16])(lVar66 + uVar78 * 4);
          lVar11 = *(long *)(lVar11 + lVar90);
          auVar100 = *(undefined1 (*) [16])(lVar11 + uVar88 * 4);
          auVar118 = vunpcklps_avx(auVar94,auVar100);
          auVar94 = vunpckhps_avx(auVar94,auVar100);
          auVar174 = vunpcklps_avx(auVar108,auVar94);
          auVar6 = vunpcklps_avx(auVar109,auVar118);
          auVar108 = vunpckhps_avx(auVar109,auVar118);
          auVar94 = *(undefined1 (*) [16])(lVar79 + uVar70 * 4);
          auVar100 = *(undefined1 (*) [16])(lVar10 + uVar82 * 4);
          auVar118 = vunpcklps_avx(auVar94,auVar100);
          auVar109 = vunpckhps_avx(auVar94,auVar100);
          auVar94 = *(undefined1 (*) [16])(lVar66 + uVar72 * 4);
          auVar100 = *(undefined1 (*) [16])(lVar11 + uVar87 * 4);
          auVar122 = vunpcklps_avx(auVar94,auVar100);
          auVar94 = vunpckhps_avx(auVar94,auVar100);
          auVar163 = vunpcklps_avx(auVar109,auVar94);
          auVar130 = vunpcklps_avx(auVar118,auVar122);
          auVar109 = vunpckhps_avx(auVar118,auVar122);
          auVar94 = *(undefined1 (*) [16])(lVar79 + uVar67 * 4);
          auVar100 = *(undefined1 (*) [16])(lVar10 + uVar83 * 4);
          auVar122 = vunpcklps_avx(auVar94,auVar100);
          auVar118 = vunpckhps_avx(auVar94,auVar100);
          auVar94 = *(undefined1 (*) [16])(lVar66 + uVar73 * 4);
          auVar100 = *(undefined1 (*) [16])(lVar11 + uVar80 * 4);
          auVar101 = vunpcklps_avx(auVar94,auVar100);
          auVar94 = vunpckhps_avx(auVar94,auVar100);
          auVar147 = vunpcklps_avx(auVar118,auVar94);
          auVar166 = vunpcklps_avx(auVar122,auVar101);
          auVar118 = vunpckhps_avx(auVar122,auVar101);
          auVar94 = *(undefined1 (*) [16])(lVar79 + uVar71 * 4);
          auVar100 = *(undefined1 (*) [16])(lVar10 + uVar84 * 4);
          auVar101 = vunpcklps_avx(auVar94,auVar100);
          auVar122 = vunpckhps_avx(auVar94,auVar100);
          auVar94 = *(undefined1 (*) [16])(lVar66 + uVar74 * 4);
          auVar100 = *(undefined1 (*) [16])(lVar11 + uVar85 * 4);
          auVar123 = vunpcklps_avx(auVar94,auVar100);
          auVar94 = vunpckhps_avx(auVar94,auVar100);
          auVar100 = vunpcklps_avx(auVar122,auVar94);
          auVar122 = vunpcklps_avx(auVar101,auVar123);
          auVar94 = vunpckhps_avx(auVar101,auVar123);
          fVar31 = 1.0 - fVar4;
          auVar171._4_4_ = fVar31;
          auVar171._0_4_ = fVar31;
          auVar171._8_4_ = fVar31;
          auVar171._12_4_ = fVar31;
          auVar101._0_4_ = fVar4 * auVar6._0_4_;
          auVar101._4_4_ = fVar4 * auVar6._4_4_;
          auVar101._8_4_ = fVar4 * auVar6._8_4_;
          auVar101._12_4_ = fVar4 * auVar6._12_4_;
          auVar6 = vfmadd231ps_fma(auVar101,auVar171,local_b90);
          auVar139._0_4_ = fVar4 * auVar108._0_4_;
          auVar139._4_4_ = fVar4 * auVar108._4_4_;
          auVar139._8_4_ = fVar4 * auVar108._8_4_;
          auVar139._12_4_ = fVar4 * auVar108._12_4_;
          auVar108 = vfmadd231ps_fma(auVar139,auVar171,auVar93);
          auVar123._0_4_ = auVar174._0_4_ * fVar4;
          auVar123._4_4_ = auVar174._4_4_ * fVar4;
          auVar123._8_4_ = auVar174._8_4_ * fVar4;
          auVar123._12_4_ = auVar174._12_4_ * fVar4;
          auVar93 = vfmadd231ps_fma(auVar123,auVar171,auVar95);
          auVar174._0_4_ = fVar4 * auVar130._0_4_;
          auVar174._4_4_ = fVar4 * auVar130._4_4_;
          auVar174._8_4_ = fVar4 * auVar130._8_4_;
          auVar174._12_4_ = fVar4 * auVar130._12_4_;
          auVar174 = vfmadd231ps_fma(auVar174,auVar171,auVar110);
          auVar130._0_4_ = fVar4 * auVar109._0_4_;
          auVar130._4_4_ = fVar4 * auVar109._4_4_;
          auVar130._8_4_ = fVar4 * auVar109._8_4_;
          auVar130._12_4_ = fVar4 * auVar109._12_4_;
          auVar109 = vfmadd231ps_fma(auVar130,auVar171,auVar117);
          auVar110._0_4_ = auVar163._0_4_ * fVar4;
          auVar110._4_4_ = auVar163._4_4_ * fVar4;
          auVar110._8_4_ = auVar163._8_4_ * fVar4;
          auVar110._12_4_ = auVar163._12_4_ * fVar4;
          auVar117 = vfmadd231ps_fma(auVar110,auVar171,auVar119);
          auVar119._0_4_ = fVar4 * auVar166._0_4_;
          auVar119._4_4_ = fVar4 * auVar166._4_4_;
          auVar119._8_4_ = fVar4 * auVar166._8_4_;
          auVar119._12_4_ = fVar4 * auVar166._12_4_;
          auVar119 = vfmadd231ps_fma(auVar119,auVar171,auVar142);
          auVar163._0_4_ = auVar118._0_4_ * fVar4;
          auVar163._4_4_ = auVar118._4_4_ * fVar4;
          auVar163._8_4_ = auVar118._8_4_ * fVar4;
          auVar163._12_4_ = auVar118._12_4_ * fVar4;
          auVar118 = vfmadd231ps_fma(auVar163,auVar171,local_be0);
          auVar166._0_4_ = auVar147._0_4_ * fVar4;
          auVar166._4_4_ = auVar147._4_4_ * fVar4;
          auVar166._8_4_ = auVar147._8_4_ * fVar4;
          auVar166._12_4_ = auVar147._12_4_ * fVar4;
          auVar163 = vfmadd231ps_fma(auVar166,auVar171,local_ba0);
          auVar142._0_4_ = fVar4 * auVar122._0_4_;
          auVar142._4_4_ = fVar4 * auVar122._4_4_;
          auVar142._8_4_ = fVar4 * auVar122._8_4_;
          auVar142._12_4_ = fVar4 * auVar122._12_4_;
          auVar147._0_4_ = auVar94._0_4_ * fVar4;
          auVar147._4_4_ = auVar94._4_4_ * fVar4;
          auVar147._8_4_ = auVar94._8_4_ * fVar4;
          auVar147._12_4_ = auVar94._12_4_ * fVar4;
          lVar66 = uVar89 + 0x40 + lVar65;
          local_b00 = *(undefined8 *)(lVar66 + 0x10);
          uStack_af8 = *(undefined8 *)(lVar66 + 0x18);
          auVar95._0_4_ = auVar100._0_4_ * fVar4;
          auVar95._4_4_ = auVar100._4_4_ * fVar4;
          auVar95._8_4_ = auVar100._8_4_ * fVar4;
          auVar95._12_4_ = auVar100._12_4_ * fVar4;
          uStack_af0 = local_b00;
          uStack_ae8 = uStack_af8;
          lVar65 = uVar89 + 0x50 + lVar65;
          local_b20 = *(undefined8 *)(lVar65 + 0x10);
          uStack_b18 = *(undefined8 *)(lVar65 + 0x18);
          auVar94 = vfmadd231ps_fma(auVar142,auVar171,local_bc0);
          auVar100 = vfmadd231ps_fma(auVar147,auVar171,local_bd0);
          auVar122 = vfmadd231ps_fma(auVar95,auVar171,local_bb0);
          uStack_b10 = local_b20;
          uStack_b08 = uStack_b18;
          auVar103._16_16_ = auVar119;
          auVar103._0_16_ = auVar6;
          auVar120._16_16_ = auVar118;
          auVar120._0_16_ = auVar108;
          auVar124._16_16_ = auVar163;
          auVar124._0_16_ = auVar93;
          auVar167._16_16_ = auVar174;
          auVar167._0_16_ = auVar174;
          auVar131._16_16_ = auVar109;
          auVar131._0_16_ = auVar109;
          auVar111._16_16_ = auVar117;
          auVar111._0_16_ = auVar117;
          auVar175._16_16_ = auVar94;
          auVar175._0_16_ = auVar94;
          auVar148._16_16_ = auVar100;
          auVar148._0_16_ = auVar100;
          uVar69 = *(undefined4 *)(ray + k * 4);
          auVar169._4_4_ = uVar69;
          auVar169._0_4_ = uVar69;
          auVar169._8_4_ = uVar69;
          auVar169._12_4_ = uVar69;
          auVar169._16_4_ = uVar69;
          auVar169._20_4_ = uVar69;
          auVar169._24_4_ = uVar69;
          auVar169._28_4_ = uVar69;
          uVar69 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar170._4_4_ = uVar69;
          auVar170._0_4_ = uVar69;
          auVar170._8_4_ = uVar69;
          auVar170._12_4_ = uVar69;
          auVar170._16_4_ = uVar69;
          auVar170._20_4_ = uVar69;
          auVar170._24_4_ = uVar69;
          auVar170._28_4_ = uVar69;
          auVar98._16_16_ = auVar122;
          auVar98._0_16_ = auVar122;
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar172._4_4_ = uVar5;
          auVar172._0_4_ = uVar5;
          auVar172._8_4_ = uVar5;
          auVar172._12_4_ = uVar5;
          auVar172._16_4_ = uVar5;
          auVar172._20_4_ = uVar5;
          auVar172._24_4_ = uVar5;
          auVar172._28_4_ = uVar5;
          local_c20 = vsubps_avx(auVar103,auVar169);
          local_c40 = vsubps_avx(auVar120,auVar170);
          local_c60 = vsubps_avx(auVar124,auVar172);
          auVar96 = vsubps_avx(auVar167,auVar169);
          auVar97 = vsubps_avx(auVar131,auVar170);
          auVar102 = vsubps_avx(auVar111,auVar172);
          auVar103 = vsubps_avx(auVar175,auVar169);
          auVar111 = vsubps_avx(auVar148,auVar170);
          auVar29 = vsubps_avx(auVar98,auVar172);
          local_c80 = vsubps_avx(auVar103,local_c20);
          local_cc0 = vsubps_avx(auVar111,local_c40);
          local_ca0 = vsubps_avx(auVar29,local_c60);
          auVar99._0_4_ = local_c20._0_4_ + auVar103._0_4_;
          auVar99._4_4_ = local_c20._4_4_ + auVar103._4_4_;
          auVar99._8_4_ = local_c20._8_4_ + auVar103._8_4_;
          auVar99._12_4_ = local_c20._12_4_ + auVar103._12_4_;
          auVar99._16_4_ = local_c20._16_4_ + auVar103._16_4_;
          auVar99._20_4_ = local_c20._20_4_ + auVar103._20_4_;
          auVar99._24_4_ = local_c20._24_4_ + auVar103._24_4_;
          auVar99._28_4_ = local_c20._28_4_ + auVar103._28_4_;
          auVar121._0_4_ = auVar111._0_4_ + local_c40._0_4_;
          auVar121._4_4_ = auVar111._4_4_ + local_c40._4_4_;
          auVar121._8_4_ = auVar111._8_4_ + local_c40._8_4_;
          auVar121._12_4_ = auVar111._12_4_ + local_c40._12_4_;
          auVar121._16_4_ = auVar111._16_4_ + local_c40._16_4_;
          auVar121._20_4_ = auVar111._20_4_ + local_c40._20_4_;
          auVar121._24_4_ = auVar111._24_4_ + local_c40._24_4_;
          fVar128 = local_c40._28_4_;
          auVar121._28_4_ = auVar111._28_4_ + fVar128;
          fVar4 = local_c60._0_4_;
          auVar125._0_4_ = auVar29._0_4_ + fVar4;
          fVar31 = local_c60._4_4_;
          auVar125._4_4_ = auVar29._4_4_ + fVar31;
          fVar13 = local_c60._8_4_;
          auVar125._8_4_ = auVar29._8_4_ + fVar13;
          fVar14 = local_c60._12_4_;
          auVar125._12_4_ = auVar29._12_4_ + fVar14;
          fVar15 = local_c60._16_4_;
          auVar125._16_4_ = auVar29._16_4_ + fVar15;
          fVar16 = local_c60._20_4_;
          auVar125._20_4_ = auVar29._20_4_ + fVar16;
          fVar17 = local_c60._24_4_;
          auVar125._24_4_ = auVar29._24_4_ + fVar17;
          fVar151 = auVar29._28_4_;
          auVar125._28_4_ = fVar151 + local_c60._28_4_;
          auVar30._4_4_ = local_ca0._4_4_ * auVar121._4_4_;
          auVar30._0_4_ = local_ca0._0_4_ * auVar121._0_4_;
          auVar30._8_4_ = local_ca0._8_4_ * auVar121._8_4_;
          auVar30._12_4_ = local_ca0._12_4_ * auVar121._12_4_;
          auVar30._16_4_ = local_ca0._16_4_ * auVar121._16_4_;
          auVar30._20_4_ = local_ca0._20_4_ * auVar121._20_4_;
          auVar30._24_4_ = local_ca0._24_4_ * auVar121._24_4_;
          auVar30._28_4_ = uVar69;
          auVar100 = vfmsub231ps_fma(auVar30,local_cc0,auVar125);
          auVar32._4_4_ = local_c80._4_4_ * auVar125._4_4_;
          auVar32._0_4_ = local_c80._0_4_ * auVar125._0_4_;
          auVar32._8_4_ = local_c80._8_4_ * auVar125._8_4_;
          auVar32._12_4_ = local_c80._12_4_ * auVar125._12_4_;
          auVar32._16_4_ = local_c80._16_4_ * auVar125._16_4_;
          auVar32._20_4_ = local_c80._20_4_ * auVar125._20_4_;
          auVar32._24_4_ = local_c80._24_4_ * auVar125._24_4_;
          auVar32._28_4_ = auVar125._28_4_;
          auVar94 = vfmsub231ps_fma(auVar32,local_ca0,auVar99);
          auVar33._4_4_ = auVar99._4_4_ * local_cc0._4_4_;
          auVar33._0_4_ = auVar99._0_4_ * local_cc0._0_4_;
          auVar33._8_4_ = auVar99._8_4_ * local_cc0._8_4_;
          auVar33._12_4_ = auVar99._12_4_ * local_cc0._12_4_;
          auVar33._16_4_ = auVar99._16_4_ * local_cc0._16_4_;
          auVar33._20_4_ = auVar99._20_4_ * local_cc0._20_4_;
          auVar33._24_4_ = auVar99._24_4_ * local_cc0._24_4_;
          auVar33._28_4_ = auVar99._28_4_;
          auVar108 = vfmsub231ps_fma(auVar33,local_c80,auVar121);
          uVar69 = *(undefined4 *)(ray + k * 4 + 0xa0);
          auVar143._4_4_ = uVar69;
          auVar143._0_4_ = uVar69;
          auVar143._8_4_ = uVar69;
          auVar143._12_4_ = uVar69;
          auVar143._16_4_ = uVar69;
          auVar143._20_4_ = uVar69;
          auVar143._24_4_ = uVar69;
          auVar143._28_4_ = uVar69;
          fStack_cd0 = *(float *)(ray + k * 4 + 0xc0);
          auVar34._4_4_ = fStack_cd0 * auVar108._4_4_;
          auVar34._0_4_ = fStack_cd0 * auVar108._0_4_;
          auVar34._8_4_ = fStack_cd0 * auVar108._8_4_;
          auVar34._12_4_ = fStack_cd0 * auVar108._12_4_;
          auVar34._16_4_ = fStack_cd0 * 0.0;
          auVar34._20_4_ = fStack_cd0 * 0.0;
          auVar34._24_4_ = fStack_cd0 * 0.0;
          auVar34._28_4_ = auVar121._28_4_;
          auVar94 = vfmadd231ps_fma(auVar34,auVar143,ZEXT1632(auVar94));
          uVar69 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar173._4_4_ = uVar69;
          auVar173._0_4_ = uVar69;
          auVar173._8_4_ = uVar69;
          auVar173._12_4_ = uVar69;
          auVar173._16_4_ = uVar69;
          auVar173._20_4_ = uVar69;
          auVar173._24_4_ = uVar69;
          auVar173._28_4_ = uVar69;
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar173,ZEXT1632(auVar100));
          local_d00 = vsubps_avx(local_c40,auVar97);
          local_d40 = vsubps_avx(local_c60,auVar102);
          auVar112._0_4_ = auVar97._0_4_ + local_c40._0_4_;
          auVar112._4_4_ = auVar97._4_4_ + local_c40._4_4_;
          auVar112._8_4_ = auVar97._8_4_ + local_c40._8_4_;
          auVar112._12_4_ = auVar97._12_4_ + local_c40._12_4_;
          auVar112._16_4_ = auVar97._16_4_ + local_c40._16_4_;
          auVar112._20_4_ = auVar97._20_4_ + local_c40._20_4_;
          auVar112._24_4_ = auVar97._24_4_ + local_c40._24_4_;
          auVar112._28_4_ = auVar97._28_4_ + fVar128;
          auVar126._0_4_ = fVar4 + auVar102._0_4_;
          auVar126._4_4_ = fVar31 + auVar102._4_4_;
          auVar126._8_4_ = fVar13 + auVar102._8_4_;
          auVar126._12_4_ = fVar14 + auVar102._12_4_;
          auVar126._16_4_ = fVar15 + auVar102._16_4_;
          auVar126._20_4_ = fVar16 + auVar102._20_4_;
          auVar126._24_4_ = fVar17 + auVar102._24_4_;
          fVar145 = auVar102._28_4_;
          auVar126._28_4_ = local_c60._28_4_ + fVar145;
          fVar144 = local_d40._0_4_;
          fVar150 = local_d40._4_4_;
          auVar35._4_4_ = fVar150 * auVar112._4_4_;
          auVar35._0_4_ = fVar144 * auVar112._0_4_;
          fVar152 = local_d40._8_4_;
          auVar35._8_4_ = fVar152 * auVar112._8_4_;
          fVar154 = local_d40._12_4_;
          auVar35._12_4_ = fVar154 * auVar112._12_4_;
          fVar156 = local_d40._16_4_;
          auVar35._16_4_ = fVar156 * auVar112._16_4_;
          fVar158 = local_d40._20_4_;
          auVar35._20_4_ = fVar158 * auVar112._20_4_;
          fVar160 = local_d40._24_4_;
          auVar35._24_4_ = fVar160 * auVar112._24_4_;
          auVar35._28_4_ = fVar128;
          auVar108 = vfmsub231ps_fma(auVar35,local_d00,auVar126);
          local_d20 = vsubps_avx(local_c20,auVar96);
          fVar128 = local_d20._0_4_;
          fVar134 = local_d20._4_4_;
          auVar36._4_4_ = auVar126._4_4_ * fVar134;
          auVar36._0_4_ = auVar126._0_4_ * fVar128;
          fVar136 = local_d20._8_4_;
          auVar36._8_4_ = auVar126._8_4_ * fVar136;
          fVar18 = local_d20._12_4_;
          auVar36._12_4_ = auVar126._12_4_ * fVar18;
          fVar20 = local_d20._16_4_;
          auVar36._16_4_ = auVar126._16_4_ * fVar20;
          fVar22 = local_d20._20_4_;
          auVar36._20_4_ = auVar126._20_4_ * fVar22;
          fVar24 = local_d20._24_4_;
          auVar36._24_4_ = auVar126._24_4_ * fVar24;
          auVar36._28_4_ = auVar126._28_4_;
          auVar164._0_4_ = local_c20._0_4_ + auVar96._0_4_;
          auVar164._4_4_ = local_c20._4_4_ + auVar96._4_4_;
          auVar164._8_4_ = local_c20._8_4_ + auVar96._8_4_;
          auVar164._12_4_ = local_c20._12_4_ + auVar96._12_4_;
          auVar164._16_4_ = local_c20._16_4_ + auVar96._16_4_;
          auVar164._20_4_ = local_c20._20_4_ + auVar96._20_4_;
          auVar164._24_4_ = local_c20._24_4_ + auVar96._24_4_;
          auVar164._28_4_ = local_c20._28_4_ + auVar96._28_4_;
          auVar100 = vfmsub231ps_fma(auVar36,local_d40,auVar164);
          fVar133 = local_d00._0_4_;
          fVar135 = local_d00._4_4_;
          auVar37._4_4_ = auVar164._4_4_ * fVar135;
          auVar37._0_4_ = auVar164._0_4_ * fVar133;
          fVar137 = local_d00._8_4_;
          auVar37._8_4_ = auVar164._8_4_ * fVar137;
          fVar19 = local_d00._12_4_;
          auVar37._12_4_ = auVar164._12_4_ * fVar19;
          fVar21 = local_d00._16_4_;
          auVar37._16_4_ = auVar164._16_4_ * fVar21;
          fVar23 = local_d00._20_4_;
          auVar37._20_4_ = auVar164._20_4_ * fVar23;
          fVar25 = local_d00._24_4_;
          auVar37._24_4_ = auVar164._24_4_ * fVar25;
          auVar37._28_4_ = local_d40._28_4_;
          auVar109 = vfmsub231ps_fma(auVar37,local_d20,auVar112);
          auVar38._4_4_ = auVar109._4_4_ * fStack_cd0;
          auVar38._0_4_ = auVar109._0_4_ * fStack_cd0;
          auVar38._8_4_ = auVar109._8_4_ * fStack_cd0;
          auVar38._12_4_ = auVar109._12_4_ * fStack_cd0;
          auVar38._16_4_ = fStack_cd0 * 0.0;
          auVar38._20_4_ = fStack_cd0 * 0.0;
          auVar38._24_4_ = fStack_cd0 * 0.0;
          auVar38._28_4_ = fVar145;
          auVar100 = vfmadd231ps_fma(auVar38,auVar143,ZEXT1632(auVar100));
          auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar173,ZEXT1632(auVar108));
          auVar30 = vsubps_avx(auVar96,auVar103);
          auVar113._0_4_ = auVar96._0_4_ + auVar103._0_4_;
          auVar113._4_4_ = auVar96._4_4_ + auVar103._4_4_;
          auVar113._8_4_ = auVar96._8_4_ + auVar103._8_4_;
          auVar113._12_4_ = auVar96._12_4_ + auVar103._12_4_;
          auVar113._16_4_ = auVar96._16_4_ + auVar103._16_4_;
          auVar113._20_4_ = auVar96._20_4_ + auVar103._20_4_;
          auVar113._24_4_ = auVar96._24_4_ + auVar103._24_4_;
          auVar113._28_4_ = auVar96._28_4_ + auVar103._28_4_;
          auVar103 = vsubps_avx(auVar97,auVar111);
          auVar132._0_4_ = auVar97._0_4_ + auVar111._0_4_;
          auVar132._4_4_ = auVar97._4_4_ + auVar111._4_4_;
          auVar132._8_4_ = auVar97._8_4_ + auVar111._8_4_;
          auVar132._12_4_ = auVar97._12_4_ + auVar111._12_4_;
          auVar132._16_4_ = auVar97._16_4_ + auVar111._16_4_;
          auVar132._20_4_ = auVar97._20_4_ + auVar111._20_4_;
          auVar132._24_4_ = auVar97._24_4_ + auVar111._24_4_;
          auVar132._28_4_ = auVar97._28_4_ + auVar111._28_4_;
          auVar111 = vsubps_avx(auVar102,auVar29);
          auVar104._0_4_ = auVar102._0_4_ + auVar29._0_4_;
          auVar104._4_4_ = auVar102._4_4_ + auVar29._4_4_;
          auVar104._8_4_ = auVar102._8_4_ + auVar29._8_4_;
          auVar104._12_4_ = auVar102._12_4_ + auVar29._12_4_;
          auVar104._16_4_ = auVar102._16_4_ + auVar29._16_4_;
          auVar104._20_4_ = auVar102._20_4_ + auVar29._20_4_;
          auVar104._24_4_ = auVar102._24_4_ + auVar29._24_4_;
          auVar104._28_4_ = fVar145 + fVar151;
          auVar29._4_4_ = auVar111._4_4_ * auVar132._4_4_;
          auVar29._0_4_ = auVar111._0_4_ * auVar132._0_4_;
          auVar29._8_4_ = auVar111._8_4_ * auVar132._8_4_;
          auVar29._12_4_ = auVar111._12_4_ * auVar132._12_4_;
          auVar29._16_4_ = auVar111._16_4_ * auVar132._16_4_;
          auVar29._20_4_ = auVar111._20_4_ * auVar132._20_4_;
          auVar29._24_4_ = auVar111._24_4_ * auVar132._24_4_;
          auVar29._28_4_ = fVar151;
          auVar109 = vfmsub231ps_fma(auVar29,auVar103,auVar104);
          auVar39._4_4_ = auVar104._4_4_ * auVar30._4_4_;
          auVar39._0_4_ = auVar104._0_4_ * auVar30._0_4_;
          auVar39._8_4_ = auVar104._8_4_ * auVar30._8_4_;
          auVar39._12_4_ = auVar104._12_4_ * auVar30._12_4_;
          auVar39._16_4_ = auVar104._16_4_ * auVar30._16_4_;
          auVar39._20_4_ = auVar104._20_4_ * auVar30._20_4_;
          auVar39._24_4_ = auVar104._24_4_ * auVar30._24_4_;
          auVar39._28_4_ = auVar104._28_4_;
          auVar108 = vfmsub231ps_fma(auVar39,auVar111,auVar113);
          auVar40._4_4_ = auVar103._4_4_ * auVar113._4_4_;
          auVar40._0_4_ = auVar103._0_4_ * auVar113._0_4_;
          auVar40._8_4_ = auVar103._8_4_ * auVar113._8_4_;
          auVar40._12_4_ = auVar103._12_4_ * auVar113._12_4_;
          auVar40._16_4_ = auVar103._16_4_ * auVar113._16_4_;
          auVar40._20_4_ = auVar103._20_4_ * auVar113._20_4_;
          auVar40._24_4_ = auVar103._24_4_ * auVar113._24_4_;
          auVar40._28_4_ = auVar113._28_4_;
          auVar93 = vfmsub231ps_fma(auVar40,auVar30,auVar132);
          fStack_cdc = fStack_cd0;
          local_ce0 = fStack_cd0;
          fStack_cd8 = fStack_cd0;
          fStack_cd4 = fStack_cd0;
          auVar114._0_4_ = fStack_cd0 * auVar93._0_4_;
          auVar114._4_4_ = fStack_cd0 * auVar93._4_4_;
          auVar114._8_4_ = fStack_cd0 * auVar93._8_4_;
          auVar114._12_4_ = fStack_cd0 * auVar93._12_4_;
          auVar114._16_4_ = fStack_cd0 * 0.0;
          auVar114._20_4_ = fStack_cd0 * 0.0;
          auVar114._24_4_ = fStack_cd0 * 0.0;
          auVar114._28_4_ = 0;
          auVar108 = vfmadd231ps_fma(auVar114,auVar143,ZEXT1632(auVar108));
          auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar173,ZEXT1632(auVar109));
          local_ae0 = auVar94._0_4_;
          fStack_adc = auVar94._4_4_;
          fStack_ad8 = auVar94._8_4_;
          fStack_ad4 = auVar94._12_4_;
          local_aa0 = ZEXT1632(CONCAT412(auVar108._12_4_ + fStack_ad4 + auVar100._12_4_,
                                         CONCAT48(auVar108._8_4_ + fStack_ad8 + auVar100._8_4_,
                                                  CONCAT44(auVar108._4_4_ +
                                                           fStack_adc + auVar100._4_4_,
                                                           auVar108._0_4_ +
                                                           local_ae0 + auVar100._0_4_))));
          auVar105._8_4_ = 0x7fffffff;
          auVar105._0_8_ = 0x7fffffff7fffffff;
          auVar105._12_4_ = 0x7fffffff;
          auVar105._16_4_ = 0x7fffffff;
          auVar105._20_4_ = 0x7fffffff;
          auVar105._24_4_ = 0x7fffffff;
          auVar105._28_4_ = 0x7fffffff;
          local_d60 = ZEXT1632(auVar94);
          auVar96 = vminps_avx(local_d60,ZEXT1632(auVar100));
          auVar96 = vminps_avx(auVar96,ZEXT1632(auVar108));
          local_d80 = vandps_avx(local_aa0,auVar105);
          fVar145 = local_d80._0_4_ * 1.1920929e-07;
          fVar151 = local_d80._4_4_ * 1.1920929e-07;
          auVar41._4_4_ = fVar151;
          auVar41._0_4_ = fVar145;
          fVar153 = local_d80._8_4_ * 1.1920929e-07;
          auVar41._8_4_ = fVar153;
          fVar155 = local_d80._12_4_ * 1.1920929e-07;
          auVar41._12_4_ = fVar155;
          fVar157 = local_d80._16_4_ * 1.1920929e-07;
          auVar41._16_4_ = fVar157;
          fVar159 = local_d80._20_4_ * 1.1920929e-07;
          auVar41._20_4_ = fVar159;
          fVar161 = local_d80._24_4_ * 1.1920929e-07;
          auVar41._24_4_ = fVar161;
          auVar41._28_4_ = 0x34000000;
          auVar140._0_8_ = CONCAT44(fVar151,fVar145) ^ 0x8000000080000000;
          auVar140._8_4_ = -fVar153;
          auVar140._12_4_ = -fVar155;
          auVar140._16_4_ = -fVar157;
          auVar140._20_4_ = -fVar159;
          auVar140._24_4_ = -fVar161;
          auVar140._28_4_ = 0xb4000000;
          auVar96 = vcmpps_avx(auVar96,auVar140,5);
          auVar102 = vmaxps_avx(local_d60,ZEXT1632(auVar100));
          auVar97 = vmaxps_avx(auVar102,ZEXT1632(auVar108));
          auVar97 = vcmpps_avx(auVar97,auVar41,2);
          auVar97 = vorps_avx(auVar96,auVar97);
          if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar97 >> 0x7f,0) != '\0') ||
                (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar97 >> 0xbf,0) != '\0') ||
              (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar97[0x1f] < '\0') {
            auVar42._4_4_ = fVar135 * local_ca0._4_4_;
            auVar42._0_4_ = fVar133 * local_ca0._0_4_;
            auVar42._8_4_ = fVar137 * local_ca0._8_4_;
            auVar42._12_4_ = fVar19 * local_ca0._12_4_;
            auVar42._16_4_ = fVar21 * local_ca0._16_4_;
            auVar42._20_4_ = fVar23 * local_ca0._20_4_;
            auVar42._24_4_ = fVar25 * local_ca0._24_4_;
            auVar42._28_4_ = auVar96._28_4_;
            auVar43._4_4_ = fVar134 * local_cc0._4_4_;
            auVar43._0_4_ = fVar128 * local_cc0._0_4_;
            auVar43._8_4_ = fVar136 * local_cc0._8_4_;
            auVar43._12_4_ = fVar18 * local_cc0._12_4_;
            auVar43._16_4_ = fVar20 * local_cc0._16_4_;
            auVar43._20_4_ = fVar22 * local_cc0._20_4_;
            auVar43._24_4_ = fVar24 * local_cc0._24_4_;
            auVar43._28_4_ = 0x34000000;
            auVar94 = vfmsub213ps_fma(local_cc0,local_d40,auVar42);
            auVar44._4_4_ = auVar103._4_4_ * fVar150;
            auVar44._0_4_ = auVar103._0_4_ * fVar144;
            auVar44._8_4_ = auVar103._8_4_ * fVar152;
            auVar44._12_4_ = auVar103._12_4_ * fVar154;
            auVar44._16_4_ = auVar103._16_4_ * fVar156;
            auVar44._20_4_ = auVar103._20_4_ * fVar158;
            auVar44._24_4_ = auVar103._24_4_ * fVar160;
            auVar44._28_4_ = auVar102._28_4_;
            auVar45._4_4_ = fVar134 * auVar111._4_4_;
            auVar45._0_4_ = fVar128 * auVar111._0_4_;
            auVar45._8_4_ = fVar136 * auVar111._8_4_;
            auVar45._12_4_ = fVar18 * auVar111._12_4_;
            auVar45._16_4_ = fVar20 * auVar111._16_4_;
            auVar45._20_4_ = fVar22 * auVar111._20_4_;
            auVar45._24_4_ = fVar24 * auVar111._24_4_;
            auVar45._28_4_ = local_d80._28_4_;
            auVar108 = vfmsub213ps_fma(auVar111,local_d00,auVar44);
            auVar96 = vandps_avx(auVar42,auVar105);
            auVar102 = vandps_avx(auVar44,auVar105);
            auVar96 = vcmpps_avx(auVar96,auVar102,1);
            local_a80 = vblendvps_avx(ZEXT1632(auVar108),ZEXT1632(auVar94),auVar96);
            auVar46._4_4_ = fVar135 * auVar30._4_4_;
            auVar46._0_4_ = fVar133 * auVar30._0_4_;
            auVar46._8_4_ = fVar137 * auVar30._8_4_;
            auVar46._12_4_ = fVar19 * auVar30._12_4_;
            auVar46._16_4_ = fVar21 * auVar30._16_4_;
            auVar46._20_4_ = fVar23 * auVar30._20_4_;
            auVar46._24_4_ = fVar25 * auVar30._24_4_;
            auVar46._28_4_ = auVar96._28_4_;
            auVar94 = vfmsub213ps_fma(auVar30,local_d40,auVar45);
            auVar47._4_4_ = local_c80._4_4_ * fVar150;
            auVar47._0_4_ = local_c80._0_4_ * fVar144;
            auVar47._8_4_ = local_c80._8_4_ * fVar152;
            auVar47._12_4_ = local_c80._12_4_ * fVar154;
            auVar47._16_4_ = local_c80._16_4_ * fVar156;
            auVar47._20_4_ = local_c80._20_4_ * fVar158;
            auVar47._24_4_ = local_c80._24_4_ * fVar160;
            auVar47._28_4_ = auVar102._28_4_;
            auVar108 = vfmsub213ps_fma(local_ca0,local_d20,auVar47);
            auVar96 = vandps_avx(auVar47,auVar105);
            auVar102 = vandps_avx(auVar45,auVar105);
            auVar96 = vcmpps_avx(auVar96,auVar102,1);
            local_a60 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar108),auVar96);
            auVar94 = vfmsub213ps_fma(local_c80,local_d00,auVar43);
            auVar108 = vfmsub213ps_fma(auVar103,local_d20,auVar46);
            auVar96 = vandps_avx(auVar43,auVar105);
            auVar102 = vandps_avx(auVar46,auVar105);
            auVar96 = vcmpps_avx(auVar96,auVar102,1);
            local_a40 = vblendvps_avx(ZEXT1632(auVar108),ZEXT1632(auVar94),auVar96);
            auVar94 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
            fVar128 = local_a40._0_4_;
            auVar106._0_4_ = fVar128 * fStack_cd0;
            fVar145 = local_a40._4_4_;
            auVar106._4_4_ = fVar145 * fStack_cd0;
            fVar133 = local_a40._8_4_;
            auVar106._8_4_ = fVar133 * fStack_cd0;
            fVar134 = local_a40._12_4_;
            auVar106._12_4_ = fVar134 * fStack_cd0;
            fVar135 = local_a40._16_4_;
            auVar106._16_4_ = fVar135 * fStack_cd0;
            fVar136 = local_a40._20_4_;
            auVar106._20_4_ = fVar136 * fStack_cd0;
            fVar137 = local_a40._24_4_;
            auVar106._24_4_ = fVar137 * fStack_cd0;
            auVar106._28_4_ = 0;
            auVar108 = vfmadd213ps_fma(auVar143,local_a60,auVar106);
            auVar108 = vfmadd213ps_fma(auVar173,local_a80,ZEXT1632(auVar108));
            auVar102 = ZEXT1632(CONCAT412(auVar108._12_4_ + auVar108._12_4_,
                                          CONCAT48(auVar108._8_4_ + auVar108._8_4_,
                                                   CONCAT44(auVar108._4_4_ + auVar108._4_4_,
                                                            auVar108._0_4_ + auVar108._0_4_))));
            auVar48._4_4_ = fVar145 * fVar31;
            auVar48._0_4_ = fVar128 * fVar4;
            auVar48._8_4_ = fVar133 * fVar13;
            auVar48._12_4_ = fVar134 * fVar14;
            auVar48._16_4_ = fVar135 * fVar15;
            auVar48._20_4_ = fVar136 * fVar16;
            auVar48._24_4_ = fVar137 * fVar17;
            auVar48._28_4_ = auVar97._28_4_;
            auVar108 = vfmadd213ps_fma(local_c40,local_a60,auVar48);
            auVar109 = vfmadd213ps_fma(local_c20,local_a80,ZEXT1632(auVar108));
            auVar96 = vrcpps_avx(auVar102);
            auVar168._8_4_ = 0x3f800000;
            auVar168._0_8_ = &DAT_3f8000003f800000;
            auVar168._12_4_ = 0x3f800000;
            auVar168._16_4_ = 0x3f800000;
            auVar168._20_4_ = 0x3f800000;
            auVar168._24_4_ = 0x3f800000;
            auVar168._28_4_ = 0x3f800000;
            auVar108 = vfnmadd213ps_fma(auVar96,auVar102,auVar168);
            auVar108 = vfmadd132ps_fma(ZEXT1632(auVar108),auVar96,auVar96);
            local_9c0 = ZEXT1632(CONCAT412(auVar108._12_4_ * (auVar109._12_4_ + auVar109._12_4_),
                                           CONCAT48(auVar108._8_4_ *
                                                    (auVar109._8_4_ + auVar109._8_4_),
                                                    CONCAT44(auVar108._4_4_ *
                                                             (auVar109._4_4_ + auVar109._4_4_),
                                                             auVar108._0_4_ *
                                                             (auVar109._0_4_ + auVar109._0_4_)))));
            uVar69 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar149._4_4_ = uVar69;
            auVar149._0_4_ = uVar69;
            auVar149._8_4_ = uVar69;
            auVar149._12_4_ = uVar69;
            auVar149._16_4_ = uVar69;
            auVar149._20_4_ = uVar69;
            auVar149._24_4_ = uVar69;
            auVar149._28_4_ = uVar69;
            uVar69 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar165._4_4_ = uVar69;
            auVar165._0_4_ = uVar69;
            auVar165._8_4_ = uVar69;
            auVar165._12_4_ = uVar69;
            auVar165._16_4_ = uVar69;
            auVar165._20_4_ = uVar69;
            auVar165._24_4_ = uVar69;
            auVar165._28_4_ = uVar69;
            auVar96 = vcmpps_avx(auVar149,local_9c0,2);
            auVar97 = vcmpps_avx(local_9c0,auVar165,2);
            auVar96 = vandps_avx(auVar96,auVar97);
            auVar108 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
            auVar94 = vpand_avx(auVar108,auVar94);
            auVar96 = vpmovsxwd_avx2(auVar94);
            if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar96 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar96 >> 0x7f,0) != '\0') ||
                  (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar96 >> 0xbf,0) != '\0') ||
                (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar96[0x1f] < '\0') {
              auVar96 = vcmpps_avx(auVar102,_DAT_02020f00,4);
              auVar108 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
              auVar94 = vpand_avx(auVar94,auVar108);
              local_a20 = vpmovsxwd_avx2(auVar94);
              if ((((((((local_a20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_a20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_a20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_a20 >> 0x7f,0) != '\0') ||
                    (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_a20 >> 0xbf,0) != '\0') ||
                  (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_a20[0x1f] < '\0') {
                uStack_ad0 = 0;
                uStack_acc = 0;
                uStack_ac8 = 0;
                uStack_ac4 = 0;
                local_ac0 = ZEXT1632(auVar100);
                local_940 = local_b40;
                auVar96 = vrcpps_avx(local_aa0);
                auVar127._8_4_ = 0x3f800000;
                auVar127._0_8_ = &DAT_3f8000003f800000;
                auVar127._12_4_ = 0x3f800000;
                auVar127._16_4_ = 0x3f800000;
                auVar127._20_4_ = 0x3f800000;
                auVar127._24_4_ = 0x3f800000;
                auVar127._28_4_ = 0x3f800000;
                auVar108 = vfnmadd213ps_fma(local_aa0,auVar96,auVar127);
                auVar108 = vfmadd132ps_fma(ZEXT1632(auVar108),auVar96,auVar96);
                auVar115._8_4_ = 0x219392ef;
                auVar115._0_8_ = 0x219392ef219392ef;
                auVar115._12_4_ = 0x219392ef;
                auVar115._16_4_ = 0x219392ef;
                auVar115._20_4_ = 0x219392ef;
                auVar115._24_4_ = 0x219392ef;
                auVar115._28_4_ = 0x219392ef;
                auVar96 = vcmpps_avx(local_d80,auVar115,5);
                auVar96 = vandps_avx(auVar96,ZEXT1632(auVar108));
                auVar49._4_4_ = fStack_adc * auVar96._4_4_;
                auVar49._0_4_ = local_ae0 * auVar96._0_4_;
                auVar49._8_4_ = fStack_ad8 * auVar96._8_4_;
                auVar49._12_4_ = fStack_ad4 * auVar96._12_4_;
                auVar49._16_4_ = auVar96._16_4_ * 0.0;
                auVar49._20_4_ = auVar96._20_4_ * 0.0;
                auVar49._24_4_ = auVar96._24_4_ * 0.0;
                auVar49._28_4_ = 0;
                auVar97 = vminps_avx(auVar49,auVar127);
                auVar50._4_4_ = auVar100._4_4_ * auVar96._4_4_;
                auVar50._0_4_ = auVar100._0_4_ * auVar96._0_4_;
                auVar50._8_4_ = auVar100._8_4_ * auVar96._8_4_;
                auVar50._12_4_ = auVar100._12_4_ * auVar96._12_4_;
                auVar50._16_4_ = auVar96._16_4_ * 0.0;
                auVar50._20_4_ = auVar96._20_4_ * 0.0;
                auVar50._24_4_ = auVar96._24_4_ * 0.0;
                auVar50._28_4_ = auVar96._28_4_;
                auVar96 = vminps_avx(auVar50,auVar127);
                auVar102 = vsubps_avx(auVar127,auVar97);
                auVar103 = vsubps_avx(auVar127,auVar96);
                local_9e0 = vblendvps_avx(auVar96,auVar102,local_b40);
                local_a00 = vblendvps_avx(auVar97,auVar103,local_b40);
                local_980._4_4_ = (float)local_b60._4_4_ * local_a60._4_4_;
                local_980._0_4_ = (float)local_b60._0_4_ * local_a60._0_4_;
                local_980._8_4_ = fStack_b58 * local_a60._8_4_;
                local_980._12_4_ = fStack_b54 * local_a60._12_4_;
                local_980._16_4_ = fStack_b50 * local_a60._16_4_;
                local_980._20_4_ = fStack_b4c * local_a60._20_4_;
                local_980._24_4_ = fStack_b48 * local_a60._24_4_;
                local_980._28_4_ = local_9e0._28_4_;
                local_960._4_4_ = (float)local_b60._4_4_ * fVar145;
                local_960._0_4_ = (float)local_b60._0_4_ * fVar128;
                local_960._8_4_ = fStack_b58 * fVar133;
                local_960._12_4_ = fStack_b54 * fVar134;
                local_960._16_4_ = fStack_b50 * fVar135;
                local_960._20_4_ = fStack_b4c * fVar136;
                local_960._24_4_ = fStack_b48 * fVar137;
                local_960._28_4_ = uStack_b44;
                local_9a0[0] = local_a80._0_4_ * (float)local_b60._0_4_;
                local_9a0[1] = local_a80._4_4_ * (float)local_b60._4_4_;
                local_9a0[2] = local_a80._8_4_ * fStack_b58;
                local_9a0[3] = local_a80._12_4_ * fStack_b54;
                fStack_990 = local_a80._16_4_ * fStack_b50;
                fStack_98c = local_a80._20_4_ * fStack_b4c;
                fStack_988 = local_a80._24_4_ * fStack_b48;
                uStack_984 = local_a00._28_4_;
                auVar94 = vpacksswb_avx(auVar94,auVar94);
                uVar88 = (ulong)(byte)(SUB161(auVar94 >> 7,0) & 1 |
                                       (SUB161(auVar94 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar94 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar94 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar94 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar94 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar94 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar94 >> 0x3f,0) << 7);
                fStack_ccc = fStack_cd0;
                fStack_cc8 = fStack_cd0;
                fStack_cc4 = fStack_cd0;
                do {
                  uVar70 = 0;
                  for (uVar67 = uVar88; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000
                      ) {
                    uVar70 = uVar70 + 1;
                  }
                  uVar62 = *(uint *)((long)&local_b00 + uVar70 * 4);
                  pGVar9 = (pSVar7->geometries).items[uVar62].ptr;
                  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    uVar88 = uVar88 ^ 1L << (uVar70 & 0x3f);
                    bVar92 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar92 = false;
                  }
                  else {
                    uVar69 = *(undefined4 *)(ray + k * 4 + 0x100);
                    uVar67 = (ulong)(uint)((int)uVar70 * 4);
                    local_8c0 = *(undefined4 *)(local_a00 + uVar67);
                    uVar5 = *(undefined4 *)(local_9e0 + uVar67);
                    local_8a0._4_4_ = uVar5;
                    local_8a0._0_4_ = uVar5;
                    local_8a0._8_4_ = uVar5;
                    local_8a0._12_4_ = uVar5;
                    local_8a0._16_4_ = uVar5;
                    local_8a0._20_4_ = uVar5;
                    local_8a0._24_4_ = uVar5;
                    local_8a0._28_4_ = uVar5;
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_9c0 + uVar67);
                    local_db0.context = context->user;
                    uVar5 = *(undefined4 *)((long)&local_b20 + uVar67);
                    local_880._4_4_ = uVar5;
                    local_880._0_4_ = uVar5;
                    local_880._8_4_ = uVar5;
                    local_880._12_4_ = uVar5;
                    local_880._16_4_ = uVar5;
                    local_880._20_4_ = uVar5;
                    local_880._24_4_ = uVar5;
                    local_880._28_4_ = uVar5;
                    uVar5 = *(undefined4 *)((long)local_9a0 + uVar67);
                    local_900 = *(undefined4 *)(local_980 + uVar67);
                    local_8e0 = *(undefined4 *)(local_960 + uVar67);
                    local_860._4_4_ = uVar62;
                    local_860._0_4_ = uVar62;
                    local_860._8_4_ = uVar62;
                    local_860._12_4_ = uVar62;
                    local_860._16_4_ = uVar62;
                    local_860._20_4_ = uVar62;
                    local_860._24_4_ = uVar62;
                    local_860._28_4_ = uVar62;
                    local_920[0] = (RTCHitN)(char)uVar5;
                    local_920[1] = (RTCHitN)(char)((uint)uVar5 >> 8);
                    local_920[2] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                    local_920[3] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                    local_920[4] = (RTCHitN)(char)uVar5;
                    local_920[5] = (RTCHitN)(char)((uint)uVar5 >> 8);
                    local_920[6] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                    local_920[7] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                    local_920[8] = (RTCHitN)(char)uVar5;
                    local_920[9] = (RTCHitN)(char)((uint)uVar5 >> 8);
                    local_920[10] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                    local_920[0xb] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                    local_920[0xc] = (RTCHitN)(char)uVar5;
                    local_920[0xd] = (RTCHitN)(char)((uint)uVar5 >> 8);
                    local_920[0xe] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                    local_920[0xf] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                    local_920[0x10] = (RTCHitN)(char)uVar5;
                    local_920[0x11] = (RTCHitN)(char)((uint)uVar5 >> 8);
                    local_920[0x12] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                    local_920[0x13] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                    local_920[0x14] = (RTCHitN)(char)uVar5;
                    local_920[0x15] = (RTCHitN)(char)((uint)uVar5 >> 8);
                    local_920[0x16] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                    local_920[0x17] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                    local_920[0x18] = (RTCHitN)(char)uVar5;
                    local_920[0x19] = (RTCHitN)(char)((uint)uVar5 >> 8);
                    local_920[0x1a] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                    local_920[0x1b] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                    local_920[0x1c] = (RTCHitN)(char)uVar5;
                    local_920[0x1d] = (RTCHitN)(char)((uint)uVar5 >> 8);
                    local_920[0x1e] = (RTCHitN)(char)((uint)uVar5 >> 0x10);
                    local_920[0x1f] = (RTCHitN)(char)((uint)uVar5 >> 0x18);
                    uStack_8fc = local_900;
                    uStack_8f8 = local_900;
                    uStack_8f4 = local_900;
                    uStack_8f0 = local_900;
                    uStack_8ec = local_900;
                    uStack_8e8 = local_900;
                    uStack_8e4 = local_900;
                    uStack_8dc = local_8e0;
                    uStack_8d8 = local_8e0;
                    uStack_8d4 = local_8e0;
                    uStack_8d0 = local_8e0;
                    uStack_8cc = local_8e0;
                    uStack_8c8 = local_8e0;
                    uStack_8c4 = local_8e0;
                    uStack_8bc = local_8c0;
                    uStack_8b8 = local_8c0;
                    uStack_8b4 = local_8c0;
                    uStack_8b0 = local_8c0;
                    uStack_8ac = local_8c0;
                    uStack_8a8 = local_8c0;
                    uStack_8a4 = local_8c0;
                    auVar96 = vpcmpeqd_avx2(local_8a0,local_8a0);
                    uStack_83c = (local_db0.context)->instID[0];
                    local_840 = uStack_83c;
                    uStack_838 = uStack_83c;
                    uStack_834 = uStack_83c;
                    uStack_830 = uStack_83c;
                    uStack_82c = uStack_83c;
                    uStack_828 = uStack_83c;
                    uStack_824 = uStack_83c;
                    uStack_81c = (local_db0.context)->instPrimID[0];
                    local_820 = uStack_81c;
                    uStack_818 = uStack_81c;
                    uStack_814 = uStack_81c;
                    uStack_810 = uStack_81c;
                    uStack_80c = uStack_81c;
                    uStack_808 = uStack_81c;
                    uStack_804 = uStack_81c;
                    local_c00 = local_b80._0_8_;
                    uStack_bf8 = local_b80._8_8_;
                    uStack_bf0 = local_b80._16_8_;
                    uStack_be8 = local_b80._24_8_;
                    local_db0.valid = (int *)&local_c00;
                    local_db0.geometryUserPtr = pGVar9->userPtr;
                    local_db0.hit = local_920;
                    local_db0.N = 8;
                    local_db0.ray = (RTCRayN *)ray;
                    if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar9->occlusionFilterN)(&local_db0);
                      auVar107._8_56_ = extraout_var;
                      auVar107._0_8_ = extraout_XMM1_Qa;
                      auVar96 = vpcmpeqd_avx2(auVar107._0_32_,auVar107._0_32_);
                    }
                    auVar59._8_8_ = uStack_bf8;
                    auVar59._0_8_ = local_c00;
                    auVar59._16_8_ = uStack_bf0;
                    auVar59._24_8_ = uStack_be8;
                    auVar102 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar59);
                    auVar97 = auVar96 & ~auVar102;
                    if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar97 >> 0x7f,0) == '\0') &&
                          (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar97 >> 0xbf,0) == '\0') &&
                        (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar97[0x1f]) {
                      auVar102 = auVar102 ^ auVar96;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var12)(&local_db0);
                      }
                      auVar60._8_8_ = uStack_bf8;
                      auVar60._0_8_ = local_c00;
                      auVar60._16_8_ = uStack_bf0;
                      auVar60._24_8_ = uStack_be8;
                      auVar96 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar60);
                      auVar102 = auVar96 ^ _DAT_0205a980;
                      auVar116._8_4_ = 0xff800000;
                      auVar116._0_8_ = 0xff800000ff800000;
                      auVar116._12_4_ = 0xff800000;
                      auVar116._16_4_ = 0xff800000;
                      auVar116._20_4_ = 0xff800000;
                      auVar116._24_4_ = 0xff800000;
                      auVar116._28_4_ = 0xff800000;
                      auVar96 = vblendvps_avx(auVar116,*(undefined1 (*) [32])(local_db0.ray + 0x100)
                                              ,auVar96);
                      *(undefined1 (*) [32])(local_db0.ray + 0x100) = auVar96;
                    }
                    bVar57 = (auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar58 = (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar56 = (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar55 = SUB321(auVar102 >> 0x7f,0) == '\0';
                    bVar54 = (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar53 = SUB321(auVar102 >> 0xbf,0) == '\0';
                    bVar52 = (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar51 = -1 < auVar102[0x1f];
                    bVar92 = ((((((bVar57 && bVar58) && bVar56) && bVar55) && bVar54) && bVar53) &&
                             bVar52) && bVar51;
                    if (((((((bVar57 && bVar58) && bVar56) && bVar55) && bVar54) && bVar53) &&
                        bVar52) && bVar51) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar69;
                      uVar88 = uVar88 ^ 1L << (uVar70 & 0x3f);
                    }
                  }
                  if (!bVar92) {
                    uVar62 = 0;
                    if (bVar91) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                      uVar62 = 1;
                    }
                    goto LAB_00601c13;
                  }
                } while (uVar88 != 0);
              }
            }
          }
          uVar62 = 0;
          uVar63 = uVar63 + 1;
          bVar91 = uVar63 < uVar64;
        } while (uVar63 != uVar64);
      }
    }
LAB_00601c13:
  } while ((uVar62 & 3) == 0);
  return puVar76 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }